

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::RgbToBgr
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffe74;
  FunctionTask *this;
  Image *in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe94;
  Image *in_stack_fffffffffffffe98;
  __atomic_base<unsigned_long> in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  
  this = (FunctionTask *)&stack0xfffffffffffffe98;
  FunctionTask::FunctionTask(this);
  FunctionTask::RgbToBgr
            ((FunctionTask *)in_stack_fffffffffffffea0._M_i,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (uint32_t)((ulong)this >> 0x20),in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffec0);
  FunctionTask::~FunctionTask((FunctionTask *)CONCAT44(in_stack_fffffffffffffe74,in_stack_00000008))
  ;
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height )
    {
        FunctionTask().RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
    }